

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

void deqp::gls::calcShaderColorCoord<unsigned_int>
               (Vec2 *coord,Vec3 *color,Vector<unsigned_int,_4> *attribValue,bool isCoordinate,
               int numComponents)

{
  uint uVar1;
  undefined7 in_register_00000009;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined8 local_1c;
  float local_14;
  
  dVar7 = (double)DAT_016ff520;
  dVar9 = DAT_016ff520._8_8_;
  if ((int)CONCAT71(in_register_00000009,isCoordinate) == 0) {
    switch(numComponents + -1) {
    case 0:
      tcu::operator*((tcu *)&local_1c,(float)attribValue->m_data[0],color);
      color->m_data[2] = local_14;
      *(undefined8 *)color->m_data = local_1c;
      break;
    case 1:
      auVar6._0_8_ = *(ulong *)attribValue->m_data & 0xffffffff;
      auVar6._8_4_ = (int)(*(ulong *)attribValue->m_data >> 0x20);
      auVar6._12_4_ = 0;
      *(ulong *)color->m_data =
           CONCAT44((float)(SUB168(auVar6 | _DAT_016ff520,8) - dVar9) *
                    (float)((ulong)*(undefined8 *)color->m_data >> 0x20),
                    (float)(SUB168(auVar6 | _DAT_016ff520,0) - dVar7) *
                    (float)*(undefined8 *)color->m_data);
      break;
    case 2:
      auVar5._0_8_ = *(ulong *)attribValue->m_data & 0xffffffff;
      auVar5._8_4_ = (int)(*(ulong *)attribValue->m_data >> 0x20);
      auVar5._12_4_ = 0;
      *(ulong *)color->m_data =
           CONCAT44((float)(SUB168(auVar5 | _DAT_016ff520,8) - dVar9) *
                    (float)((ulong)*(undefined8 *)color->m_data >> 0x20),
                    (float)(SUB168(auVar5 | _DAT_016ff520,0) - dVar7) *
                    (float)*(undefined8 *)color->m_data);
      color->m_data[2] = (float)attribValue->m_data[2] * color->m_data[2];
      break;
    case 3:
      fVar2 = (float)attribValue->m_data[3];
      auVar8._0_8_ = *(ulong *)attribValue->m_data & 0xffffffff;
      auVar8._8_4_ = (int)(*(ulong *)attribValue->m_data >> 0x20);
      auVar8._12_4_ = 0;
      *(ulong *)color->m_data =
           CONCAT44(fVar2 * (float)(SUB168(auVar8 | _DAT_016ff520,8) - dVar9) *
                            (float)((ulong)*(undefined8 *)color->m_data >> 0x20),
                    fVar2 * (float)(SUB168(auVar8 | _DAT_016ff520,0) - dVar7) *
                            (float)*(undefined8 *)color->m_data);
      color->m_data[2] = (float)attribValue->m_data[2] * color->m_data[2] * fVar2;
    }
  }
  else {
    switch(numComponents + -1) {
    case 0:
      uVar1 = attribValue->m_data[0];
      coord->m_data[0] = (float)uVar1;
      coord->m_data[1] = (float)uVar1;
      break;
    case 1:
      auVar4._0_8_ = *(ulong *)attribValue->m_data & 0xffffffff;
      auVar4._8_4_ = (int)(*(ulong *)attribValue->m_data >> 0x20);
      auVar4._12_4_ = 0;
      *(ulong *)coord->m_data =
           CONCAT44((float)(SUB168(auVar4 | _DAT_016ff520,8) - dVar9),
                    (float)(SUB168(auVar4 | _DAT_016ff520,0) - dVar7));
      break;
    case 2:
      uVar1 = attribValue->m_data[1];
      coord->m_data[0] = (float)attribValue->m_data[2] + (float)attribValue->m_data[0];
      coord->m_data[1] = (float)uVar1;
      break;
    case 3:
      auVar3._0_8_ = *(ulong *)attribValue->m_data & 0xffffffff;
      auVar3._8_4_ = (int)(*(ulong *)attribValue->m_data >> 0x20);
      auVar3._12_4_ = 0;
      auVar10._0_8_ = *(ulong *)(attribValue->m_data + 2) & 0xffffffff;
      auVar10._8_4_ = (int)(*(ulong *)(attribValue->m_data + 2) >> 0x20);
      auVar10._12_4_ = 0;
      *(ulong *)coord->m_data =
           CONCAT44((float)(SUB168(auVar10 | _DAT_016ff520,8) - dVar9) +
                    (float)(SUB168(auVar3 | _DAT_016ff520,8) - dVar9),
                    (float)(SUB168(auVar10 | _DAT_016ff520,0) - dVar7) +
                    (float)(SUB168(auVar3 | _DAT_016ff520,0) - dVar7));
    }
  }
  return;
}

Assistant:

void calcShaderColorCoord (tcu::Vec2& coord, tcu::Vec3& color, const tcu::Vector<T, 4>& attribValue, bool isCoordinate, int numComponents)
{
	if (isCoordinate)
		switch (numComponents)
		{
			case 1:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.x());							break;
			case 2:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.y());							break;
			case 3:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y());							break;
			case 4:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y() + (float)attribValue.w());	break;

			default:
				DE_ASSERT(false);
		}
	else
	{
		switch (numComponents)
		{
			case 1:
				color = color * (float)attribValue.x();
				break;

			case 2:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				break;

			case 3:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				color.z() = color.z() * (float)attribValue.z();
				break;

			case 4:
				color.x() = color.x() * (float)attribValue.x() * (float)attribValue.w();
				color.y() = color.y() * (float)attribValue.y() * (float)attribValue.w();
				color.z() = color.z() * (float)attribValue.z() * (float)attribValue.w();
				break;

			default:
				DE_ASSERT(false);
		}
	}
}